

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O0

upb_StringView printf_dup(upb_ToProto_Context *ctx,char *fmt,...)

{
  upb_StringView uVar1;
  char in_AL;
  int iVar2;
  char *buf;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  ulong local_60;
  size_t n;
  va_list args;
  char *p;
  size_t max;
  char *fmt_local;
  upb_ToProto_Context *ctx_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  buf = (char *)upb_Arena_Malloc(ctx->arena,0x20);
  if (buf == (char *)0x0) {
    siglongjmp((__jmp_buf_tag *)ctx->err,1);
  }
  args[0].overflow_arg_area = local_118;
  args[0]._0_8_ = &stack0x00000008;
  n._4_4_ = 0x30;
  n._0_4_ = 0x10;
  iVar2 = _upb_vsnprintf(buf,0x20,fmt,(__va_list_tag *)&n);
  local_60 = (ulong)iVar2;
  if (local_60 < 0x20) {
    uVar1.size = local_60;
    uVar1.data = buf;
    return uVar1;
  }
  __assert_fail("n < max",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto.c"
                ,0x50,"upb_StringView printf_dup(upb_ToProto_Context *, const char *, ...)");
}

Assistant:

static upb_StringView printf_dup(upb_ToProto_Context* ctx, const char* fmt,
                                 ...) {
  const size_t max = 32;
  char* p = upb_Arena_Malloc(ctx->arena, max);
  CHK_OOM(p);
  va_list args;
  va_start(args, fmt);
  size_t n = _upb_vsnprintf(p, max, fmt, args);
  va_end(args);
  UPB_ASSERT(n < max);
  return (upb_StringView){.data = p, .size = n};
}